

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void * vrna_realloc(void *p,uint size)

{
  void *pvVar1;
  int *piVar2;
  
  if (p == (void *)0x0) {
    pvVar1 = vrna_alloc(size);
    return pvVar1;
  }
  pvVar1 = realloc(p,(ulong)size);
  if (pvVar1 == (void *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      vrna_message_error("vrna_realloc allocation failure -> no memory");
    }
    if (*piVar2 == 0x16) {
      vrna_realloc_cold_1();
    }
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

PUBLIC void *
vrna_realloc(void     *p,
             unsigned size)
{
  if (p == NULL)
    return vrna_alloc(size);

  p = (void *)realloc(p, size);
  if (p == NULL) {
#ifdef EINVAL
    if (errno == EINVAL) {
      fprintf(stderr, "vrna_realloc: requested size: %d\n", size);
      vrna_message_error("vrna_realloc allocation failure -> EINVAL");
    }

    if (errno == ENOMEM)
#endif
    vrna_message_error("vrna_realloc allocation failure -> no memory");
  }

  return p;
}